

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O3

void __thiscall Imf_3_2::DeepTiledOutputFile::initialize(DeepTiledOutputFile *this,Header *header)

{
  int maxX;
  int minY;
  int maxY;
  ulong uVar1;
  pointer ppTVar2;
  LevelMode LVar3;
  LevelRoundingMode LVar4;
  uint uVar5;
  int iVar6;
  Format FVar7;
  LineOrder *pLVar8;
  TileDescription *pTVar9;
  Box2i *pBVar10;
  Compression *pCVar11;
  Compressor *pCVar12;
  TileBuffer *pTVar13;
  ArgExc *this_00;
  Data *pDVar14;
  ulong uVar15;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_1d8;
  stringstream _iex_throw_s;
  int iStack_1b4;
  int local_1b0;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_1a8 [15];
  
  Header::operator=(&this->_data->header,header);
  Header::setType(&this->_data->header,(string *)&DEEPTILE_abi_cxx11_);
  pLVar8 = Header::lineOrder(&this->_data->header);
  pDVar14 = this->_data;
  pDVar14->lineOrder = *pLVar8;
  pTVar9 = Header::tileDescription(&pDVar14->header);
  pDVar14 = this->_data;
  uVar5 = pTVar9->ySize;
  LVar3 = pTVar9->mode;
  LVar4 = pTVar9->roundingMode;
  (pDVar14->tileDesc).xSize = pTVar9->xSize;
  (pDVar14->tileDesc).ySize = uVar5;
  (pDVar14->tileDesc).mode = LVar3;
  (pDVar14->tileDesc).roundingMode = LVar4;
  pBVar10 = Header::dataWindow(&this->_data->header);
  iVar6 = (pBVar10->min).x;
  pDVar14 = this->_data;
  pDVar14->minX = iVar6;
  maxX = (pBVar10->max).x;
  pDVar14->maxX = maxX;
  minY = (pBVar10->min).y;
  pDVar14->minY = minY;
  maxY = (pBVar10->max).y;
  pDVar14->maxY = maxY;
  uVar5 = (pDVar14->tileDesc).xSize * (pDVar14->tileDesc).ySize;
  pDVar14->maxSampleCountTableSize = (ulong)uVar5 * 4;
  if (uVar5 < 0x40000000) {
    precalculateTileInfo
              (&pDVar14->tileDesc,iVar6,maxX,minY,maxY,&pDVar14->numXTiles,&pDVar14->numYTiles,
               &pDVar14->numXLevels,&pDVar14->numYLevels);
    pDVar14 = this->_data;
    if (pDVar14->lineOrder == INCREASING_Y) {
      iVar6 = 0;
    }
    else {
      iVar6 = *pDVar14->numYTiles + -1;
    }
    (pDVar14->nextTileToWrite).dx = 0;
    (pDVar14->nextTileToWrite).dy = iVar6;
    (pDVar14->nextTileToWrite).lx = 0;
    (pDVar14->nextTileToWrite).ly = 0;
    pCVar11 = Header::compression(&pDVar14->header);
    pCVar12 = newTileCompressor(*pCVar11,0,(ulong)(this->_data->tileDesc).ySize,&this->_data->header
                               );
    FVar7 = defaultFormat(pCVar12);
    pDVar14 = this->_data;
    pDVar14->format = FVar7;
    if (pCVar12 != (Compressor *)0x0) {
      (*pCVar12->_vptr_Compressor[1])(pCVar12);
      pDVar14 = this->_data;
    }
    TileOffsets::TileOffsets
              ((TileOffsets *)&_iex_throw_s,(pDVar14->tileDesc).mode,pDVar14->numXLevels,
               pDVar14->numYLevels,pDVar14->numXTiles,pDVar14->numYTiles);
    pDVar14 = this->_data;
    (pDVar14->tileOffsets)._numYLevels = local_1b0;
    (pDVar14->tileOffsets)._mode = __iex_throw_s;
    (pDVar14->tileOffsets)._numXLevels = iStack_1b4;
    local_1d8.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pDVar14->tileOffsets)._offsets.
         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pDVar14->tileOffsets)._offsets.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1a8[0].
         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1d8.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pDVar14->tileOffsets)._offsets.
         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_1d8.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pDVar14->tileOffsets)._offsets.
         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pDVar14->tileOffsets)._offsets.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_1a8[0].
         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (pDVar14->tileOffsets)._offsets.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_1a8[0].
         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_1a8[0].
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8[0].
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8[0].
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::~vector(&local_1d8);
    std::
    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::~vector(local_1a8);
    pDVar14 = this->_data;
    iVar6 = getChunkOffsetTableSize(&pDVar14->header);
    Header::setChunkCount(&pDVar14->header,iVar6);
    if ((this->_data->tileBuffers).
        super__Vector_base<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->_data->tileBuffers).
        super__Vector_base<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar15 = 0;
      do {
        pTVar13 = (TileBuffer *)operator_new(0xb8);
        (pTVar13->sampleCount)._sizeX = 0;
        (pTVar13->sampleCount)._sizeY = 0;
        (pTVar13->sampleCount)._data = (uint *)0x0;
        pTVar13->uncompressedData = (char *)0x0;
        pTVar13->dataSize = 0;
        pTVar13->uncompressedDataSize = 0;
        pTVar13->compressor = (Compressor *)0x0;
        pTVar13->format = NATIVE;
        pTVar13->dx = 0;
        pTVar13->ly = 0;
        pTVar13->hasException = false;
        *(undefined3 *)&pTVar13->field_0x55 = 0;
        (pTVar13->exception)._M_dataplus._M_p = (pointer)0x0;
        *(undefined8 *)((long)&(pTVar13->exception)._M_dataplus._M_p + 1) = 0;
        *(undefined8 *)((long)&(pTVar13->exception)._M_string_length + 1) = 0;
        *(undefined1 **)((long)&(pTVar13->exception).field_2 + 8) = &pTVar13->field_0x80;
        *(undefined8 *)&pTVar13->_sem = 0;
        pTVar13->field_0x80 = 0;
        IlmThread_3_2::Semaphore::Semaphore((Semaphore *)&pTVar13->field_0x90,1);
        (this->_data->tileBuffers).
        super__Vector_base<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar15] = pTVar13;
        pDVar14 = this->_data;
        uVar1 = pDVar14->maxSampleCountTableSize;
        pTVar13 = (pDVar14->tileBuffers).
                  super__Vector_base<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar15];
        pCVar12 = (Compressor *)operator_new__(uVar1);
        if (pTVar13->compressor != (Compressor *)0x0) {
          operator_delete__(pTVar13->compressor);
          pDVar14 = this->_data;
        }
        pTVar13->uncompressedDataSize = uVar1;
        pTVar13->compressor = pCVar12;
        memset((pDVar14->tileBuffers).
               super__Vector_base<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15]->compressor,0,
               pDVar14->maxSampleCountTableSize);
        pCVar11 = Header::compression(&this->_data->header);
        pCVar12 = newCompressor(*pCVar11,this->_data->maxSampleCountTableSize,&this->_data->header);
        pDVar14 = this->_data;
        ppTVar2 = (pDVar14->tileBuffers).
                  super__Vector_base<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        *(Compressor **)&ppTVar2[uVar15]->ly = pCVar12;
        uVar15 = uVar15 + 1;
      } while (uVar15 < (ulong)((long)(pDVar14->tileBuffers).
                                      super__Vector_base<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2 >>
                               3));
    }
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Deep tile size exceeds maximum permitted area",0x2d);
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
DeepTiledOutputFile::initialize (const Header& header)
{
    _data->header = header;
    _data->header.setType (DEEPTILE);
    _data->lineOrder = _data->header.lineOrder ();

    //
    // Check that the file is indeed tiled
    //

    _data->tileDesc = _data->header.tileDescription ();

    //
    // Save the dataWindow information
    //

    const Box2i& dataWindow = _data->header.dataWindow ();
    _data->minX             = dataWindow.min.x;
    _data->maxX             = dataWindow.max.x;
    _data->minY             = dataWindow.min.y;
    _data->maxY             = dataWindow.max.y;

    _data->maxSampleCountTableSize =
        _data->tileDesc.ySize * _data->tileDesc.xSize * sizeof (int);

    //
    // impose limit of 2^32 bytes of storage for maxSampleCountTableSize
    // (disallow files with very large tile areas that would otherwise cause excessive memory allocation)
    //

    if (_data->maxSampleCountTableSize >
        std::numeric_limits<unsigned int>::max ())
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Deep tile size exceeds maximum permitted area");
    }

    //
    // Precompute level and tile information to speed up utility functions
    //

    precalculateTileInfo (
        _data->tileDesc,
        _data->minX,
        _data->maxX,
        _data->minY,
        _data->maxY,
        _data->numXTiles,
        _data->numYTiles,
        _data->numXLevels,
        _data->numYLevels);

    //
    // Determine the first tile coordinate that we will be writing
    // if the file is not RANDOM_Y.
    //

    _data->nextTileToWrite = (_data->lineOrder == INCREASING_Y)
                                 ? TileCoord (0, 0, 0, 0)
                                 : TileCoord (0, _data->numYTiles[0] - 1, 0, 0);

    Compressor* compressor = newTileCompressor (
        _data->header.compression (), 0, _data->tileDesc.ySize, _data->header);

    _data->format = defaultFormat (compressor);

    if (compressor != 0) delete compressor;

    _data->tileOffsets = TileOffsets (
        _data->tileDesc.mode,
        _data->numXLevels,
        _data->numYLevels,
        _data->numXTiles,
        _data->numYTiles);

    //ignore the existing value of chunkCount - correct it if it's wrong
    _data->header.setChunkCount (getChunkOffsetTableSize (_data->header));

    for (size_t i = 0; i < _data->tileBuffers.size (); i++)
    {
        _data->tileBuffers[i] = new TileBuffer ();

        _data->tileBuffers[i]->sampleCountTableBuffer.resizeErase (
            static_cast<long> (_data->maxSampleCountTableSize));

        char* p = &(_data->tileBuffers[i]->sampleCountTableBuffer[0]);
        memset (p, 0, _data->maxSampleCountTableSize);

        _data->tileBuffers[i]->sampleCountTableCompressor = newCompressor (
            _data->header.compression (),
            _data->maxSampleCountTableSize,
            _data->header);
    }
}